

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  u8 enc_00;
  uint uVar1;
  sqlite3 *psVar2;
  int iVar3;
  char *pcVar4;
  sqlite3 *psVar5;
  bool bVar6;
  int local_bc;
  int nOut_1;
  u8 enc;
  int nOut;
  char *zStart;
  Mem utf8;
  StrAccum out;
  Mem *pVar;
  int local_30;
  int i;
  int nToken;
  int n;
  int nextIndex;
  int idx;
  sqlite3 *db;
  char *zRawSql_local;
  Vdbe *p_local;
  
  n = 0;
  nToken = 1;
  _nextIndex = p->db;
  db = (sqlite3 *)zRawSql;
  zRawSql_local = (char *)p;
  sqlite3StrAccumInit((StrAccum *)&utf8.xDel,(sqlite3 *)0x0,(char *)0x0,0,_nextIndex->aLimit[0]);
  psVar2 = db;
  if (_nextIndex->nVdbeExec < 2) {
    if (*(short *)(zRawSql_local + 0x20) == 0) {
      iVar3 = sqlite3Strlen30((char *)db);
      sqlite3_str_append((sqlite3_str *)&utf8.xDel,(char *)psVar2,iVar3);
    }
    else {
      while (*(char *)&db->pVfs != '\0') {
        i = findNextHostParameter((char *)db,&local_30);
        sqlite3_str_append((sqlite3_str *)&utf8.xDel,(char *)db,i);
        db = (sqlite3 *)((long)&db->pVfs + (long)i);
        if (local_30 == 0) break;
        if (*(char *)&db->pVfs == '?') {
          if (local_30 < 2) {
            n = nToken;
          }
          else {
            sqlite3GetInt32((char *)((long)&db->pVfs + 1),&n);
          }
        }
        else {
          n = sqlite3VdbeParameterIndex((Vdbe *)zRawSql_local,(char *)db,local_30);
        }
        db = (sqlite3 *)((long)&db->pVfs + (long)local_30);
        if (nToken < n + 1) {
          local_bc = n + 1;
        }
        else {
          local_bc = nToken;
        }
        nToken = local_bc;
        out._24_8_ = *(long *)(zRawSql_local + 0x80) + (long)(n + -1) * 0x38;
        if ((*(uint *)(out._24_8_ + 0x14) & 1) == 0) {
          if ((*(uint *)(out._24_8_ + 0x14) & 0x24) == 0) {
            if ((*(uint *)(out._24_8_ + 0x14) & 8) == 0) {
              if ((*(uint *)(out._24_8_ + 0x14) & 2) == 0) {
                if ((*(uint *)(out._24_8_ + 0x14) & 0x400) == 0) {
                  sqlite3_str_append((sqlite3_str *)&utf8.xDel,"x\'",2);
                  uVar1 = *(uint *)(out._24_8_ + 0x10);
                  for (pVar._4_4_ = 0; pVar._4_4_ < (int)uVar1; pVar._4_4_ = pVar._4_4_ + 1) {
                    sqlite3_str_appendf((StrAccum *)&utf8.xDel,"%02x",
                                        (ulong)*(byte *)(*(long *)(out._24_8_ + 8) +
                                                        (long)pVar._4_4_));
                  }
                  sqlite3_str_append((sqlite3_str *)&utf8.xDel,"\'",1);
                }
                else {
                  sqlite3_str_appendf((StrAccum *)&utf8.xDel,"zeroblob(%d)",
                                      (ulong)*(uint *)out._24_8_);
                }
              }
              else {
                enc_00 = _nextIndex->enc;
                if (enc_00 != '\x01') {
                  memset(&zStart,0,0x38);
                  utf8._16_8_ = _nextIndex;
                  sqlite3VdbeMemSetStr
                            ((Mem *)&zStart,*(char **)(out._24_8_ + 8),
                             (long)(int)*(uint *)(out._24_8_ + 0x10),enc_00,
                             (_func_void_void_ptr *)0x0);
                  iVar3 = sqlite3VdbeChangeEncoding((Mem *)&zStart,1);
                  if (iVar3 == 7) {
                    out.mxAlloc._0_1_ = '\a';
                  }
                  out._24_8_ = &zStart;
                }
                sqlite3_str_appendf((StrAccum *)&utf8.xDel,"\'%.*q\'",
                                    (ulong)*(uint *)(out._24_8_ + 0x10),
                                    *(undefined8 *)(out._24_8_ + 8));
                if (enc_00 != '\x01') {
                  sqlite3VdbeMemRelease((Mem *)&zStart);
                }
              }
            }
            else {
              sqlite3_str_appendf((StrAccum *)&utf8.xDel,"%!.15g",*(undefined8 *)out._24_8_);
            }
          }
          else {
            sqlite3_str_appendf((StrAccum *)&utf8.xDel,"%lld",*(undefined8 *)out._24_8_);
          }
        }
        else {
          sqlite3_str_append((sqlite3_str *)&utf8.xDel,"NULL",4);
        }
      }
    }
  }
  else {
    while (psVar2 = db, *(char *)&db->pVfs != '\0') {
      do {
        psVar5 = (sqlite3 *)((long)&db->pVfs + 1);
        bVar6 = false;
        if (*(char *)&db->pVfs != '\n') {
          bVar6 = *(char *)&psVar5->pVfs != '\0';
        }
        db = psVar5;
      } while (bVar6);
      sqlite3_str_append((sqlite3_str *)&utf8.xDel,"-- ",3);
      sqlite3_str_append((sqlite3_str *)&utf8.xDel,(char *)psVar2,(int)db - (int)psVar2);
    }
  }
  if ((char)out.mxAlloc != '\0') {
    sqlite3_str_reset((StrAccum *)&utf8.xDel);
  }
  pcVar4 = sqlite3StrAccumFinish((StrAccum *)&utf8.xDel);
  return pcVar4;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}